

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)

{
  int iVar1;
  int best;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (ctxt->states != (xmlRelaxNGStatesPtr)0x0)) &&
      (0 < ctxt->states->nbState)) &&
     ((iVar1 = xmlRelaxNGBestState(ctxt), -1 < iVar1 && (iVar1 < ctxt->states->nbState)))) {
    ctxt->state = ctxt->states->tabState[iVar1];
    xmlRelaxNGValidateElementEnd(ctxt,1);
  }
  return;
}

Assistant:

static void
xmlRelaxNGLogBestError(xmlRelaxNGValidCtxtPtr ctxt)
{
    int best;

    if ((ctxt == NULL) || (ctxt->states == NULL) ||
        (ctxt->states->nbState <= 0))
        return;

    best = xmlRelaxNGBestState(ctxt);
    if ((best >= 0) && (best < ctxt->states->nbState)) {
        ctxt->state = ctxt->states->tabState[best];

        xmlRelaxNGValidateElementEnd(ctxt, 1);
    }
}